

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool scan_heredoc_end_identifier(Heredoc *heredoc,TSLexer *lexer)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  size_t __size;
  uint uVar6;
  uint32_t uVar7;
  _Bool _Var8;
  
  uVar4 = (ulong)(heredoc->current_leading_word).size;
  if (uVar4 != 0) {
    memset((heredoc->current_leading_word).contents,0,uVar4);
    (heredoc->current_leading_word).size = 0;
  }
  if ((heredoc->delimiter).size == 0) {
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    while ((iVar1 = lexer->lookahead, iVar1 != 0 && (iVar1 != 10))) {
      uVar5 = (heredoc->delimiter).size;
      if (uVar5 <= uVar4) {
        __assert_fail("(uint32_t)(size) < (&heredoc->delimiter)->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                      ,0xe9,"_Bool scan_heredoc_end_identifier(Heredoc *, TSLexer *)");
      }
      if ((iVar1 != (heredoc->delimiter).contents[uVar4]) ||
         (uVar3 = (heredoc->current_leading_word).size, uVar5 <= uVar3)) break;
      uVar5 = uVar3 + 1;
      uVar6 = (heredoc->current_leading_word).capacity;
      pcVar2 = (heredoc->current_leading_word).contents;
      if (uVar6 <= uVar3) {
        uVar6 = uVar6 * 2;
        if (uVar6 <= uVar5) {
          uVar6 = uVar5;
        }
        if (uVar6 < 9) {
          uVar6 = 8;
        }
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)malloc((ulong)uVar6);
        }
        else {
          pcVar2 = (char *)realloc(pcVar2,(ulong)uVar6);
          iVar1 = lexer->lookahead;
          uVar3 = (heredoc->current_leading_word).size;
          uVar5 = uVar3 + 1;
        }
        (heredoc->current_leading_word).contents = pcVar2;
        (heredoc->current_leading_word).capacity = uVar6;
      }
      (heredoc->current_leading_word).size = uVar5;
      pcVar2[uVar3] = (char)iVar1;
      (*lexer->advance)(lexer,false);
      uVar4 = uVar4 + 1;
    }
    uVar7 = (heredoc->current_leading_word).size;
  }
  uVar5 = uVar7 + 1;
  uVar3 = (heredoc->current_leading_word).capacity;
  pcVar2 = (heredoc->current_leading_word).contents;
  if (uVar3 < uVar5) {
    uVar3 = uVar3 * 2;
    if (uVar3 <= uVar5) {
      uVar3 = uVar5;
    }
    __size = 8;
    if (8 < uVar3) {
      __size = (size_t)uVar3;
    }
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)malloc(__size);
    }
    else {
      pcVar2 = (char *)realloc(pcVar2,__size);
      uVar7 = (heredoc->current_leading_word).size;
      uVar5 = uVar7 + 1;
    }
    (heredoc->current_leading_word).contents = pcVar2;
    (heredoc->current_leading_word).capacity = (uint32_t)__size;
  }
  (heredoc->current_leading_word).size = uVar5;
  pcVar2[uVar7] = '\0';
  if ((heredoc->delimiter).size == 0) {
    _Var8 = false;
  }
  else {
    iVar1 = strcmp((heredoc->current_leading_word).contents,(heredoc->delimiter).contents);
    _Var8 = iVar1 == 0;
  }
  return _Var8;
}

Assistant:

static bool scan_heredoc_end_identifier(Heredoc *heredoc, TSLexer *lexer) {
    reset_string(&heredoc->current_leading_word);
    // Scan the first 'n' characters on this line, to see if they match the
    // heredoc delimiter
    int32_t size = 0;
    if (heredoc->delimiter.size > 0) {
        while (lexer->lookahead != '\0' && lexer->lookahead != '\n' &&
               (int32_t)*array_get(&heredoc->delimiter, size) == lexer->lookahead &&
               heredoc->current_leading_word.size < heredoc->delimiter.size) {
            array_push(&heredoc->current_leading_word, lexer->lookahead);
            advance(lexer);
            size++;
        }
    }
    array_push(&heredoc->current_leading_word, '\0');
    return heredoc->delimiter.size == 0
               ? false
               : strcmp(heredoc->current_leading_word.contents, heredoc->delimiter.contents) == 0;
}